

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matmul.c
# Opt level: O0

void GET_BLOCK(Integer g_x,task_list_t *chunk,void *buf,char *trans,Integer xilo,Integer xjlo,
              Integer *dim_next,Integer *nbhdl)

{
  long g_a;
  Integer *lo_00;
  Integer *hi_00;
  char *in_RCX;
  int *in_RSI;
  long in_R8;
  long in_R9;
  Integer hi [2];
  Integer lo [2];
  Integer j1;
  Integer j0;
  Integer i1;
  Integer i0;
  void *in_stack_ffffffffffffffa8;
  Integer *local_38;
  
  if ((*in_RCX == 'n') || (*in_RCX == 'N')) {
    *(long *)hi[1] = (long)in_RSI[4];
    local_38 = (Integer *)(in_R8 + *in_RSI);
    g_a = in_R8 + in_RSI[2];
    lo_00 = (Integer *)(in_R9 + in_RSI[1]);
    hi_00 = (Integer *)(in_R9 + in_RSI[3]);
  }
  else {
    *(long *)hi[1] = (long)in_RSI[5];
    local_38 = (Integer *)(in_R9 + in_RSI[1]);
    g_a = in_R9 + in_RSI[3];
    lo_00 = (Integer *)(in_R8 + *in_RSI);
    hi_00 = (Integer *)(in_R8 + in_RSI[2]);
  }
  pnga_nbget(g_a,lo_00,hi_00,in_stack_ffffffffffffffa8,lo_00,local_38);
  return;
}

Assistant:

static void GET_BLOCK(Integer g_x, task_list_t *chunk, void *buf, 
		      char *trans, Integer xilo, Integer xjlo, 
		      Integer *dim_next, Integer *nbhdl) {

    Integer i0, i1, j0, j1;
    Integer lo[2], hi[2];

    if(*trans == 'n' || *trans == 'N') {
       *dim_next = chunk->dim[0];
       i0= xilo+chunk->lo[0]; i1= xilo+chunk->hi[0];
       j0= xjlo+chunk->lo[1]; j1= xjlo+chunk->hi[1];
    }
    else {
       *dim_next = chunk->dim[1];
       i0= xjlo+chunk->lo[1]; i1= xjlo+chunk->hi[1];
       j0= xilo+chunk->lo[0]; j1= xilo+chunk->hi[0];
    }

    lo[0] = i0;
    lo[1] = j0;
    hi[0] = i1;
    hi[1] = j1;
    pnga_nbget(g_x, lo, hi, buf, dim_next, nbhdl);
}